

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O3

Aig_Man_t *
Cgt_ManDupPartition(Aig_Man_t *pFrame,int nVarsMin,int nFlopsMin,int iStart,Aig_Man_t *pCare,
                   Vec_Vec_t *vSuppsInv,int *pnOutputs)

{
  int iVar1;
  int iVar2;
  uint *__ptr;
  void *pvVar3;
  Vec_Ptr_t *vLeaves;
  void **ppvVar4;
  uint *__ptr_00;
  Aig_Man_t *pNew;
  char *pcVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong local_a8;
  ulong local_a0;
  
  if (pFrame->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(pFrame) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                  ,0x1bf,
                  "Aig_Man_t *Cgt_ManDupPartition(Aig_Man_t *, int, int, int, Aig_Man_t *, Vec_Vec_t *, int *)"
                 );
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr + 2) = pvVar3;
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vLeaves->pArray = ppvVar4;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar3;
  pNew = Aig_ManStart(nVarsMin);
  pcVar5 = (char *)malloc(10);
  builtin_strncpy(pcVar5,"partition",10);
  pNew->pName = pcVar5;
  Aig_ManIncrementTravId(pFrame);
  pFrame->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  pFrame->pConst1->TravId = pFrame->nTravIds;
  if (nFlopsMin < 1) {
    uVar10 = 0;
    local_a0 = 100;
    local_a8 = 100;
    uVar11 = 0;
  }
  else {
    uVar10 = nFlopsMin + iStart;
    uVar12 = iStart + 1U;
    if ((int)(iStart + 1U) < (int)uVar10) {
      uVar12 = uVar10;
    }
    local_a0 = 100;
    local_a8 = 100;
    uVar8 = 0;
    do {
      iVar1 = (int)uVar8;
      if (pFrame->nObjs[3] <= iStart + iVar1) {
        uVar12 = iStart + iVar1;
        uVar6 = uVar8 & 0xffffffff;
        goto LAB_008ef562;
      }
      if ((iStart < 0) || (pFrame->vCos->nSize <= iStart + iVar1)) goto LAB_008ef89e;
      pvVar3 = pFrame->vCos->pArray[(uint)iStart + uVar8];
      Cgt_ManDupPartition_rec
                (pNew,pFrame,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe),
                 vLeaves);
      if (((ulong)pvVar3 & 1) != 0) goto LAB_008ef8bd;
      uVar6 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28);
      }
      iVar2 = (int)local_a8;
      if (iVar1 == iVar2) {
        if (iVar2 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = 0x10;
          local_a8 = 0x10;
        }
        else {
          local_a8 = (ulong)(uint)(iVar2 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar7 = malloc(local_a8 * 8);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr + 2),local_a8 * 8);
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = iVar2 * 2;
        }
      }
      else {
        pvVar7 = *(void **)(__ptr + 2);
      }
      __ptr[1] = iVar1 + 1;
      *(ulong *)((long)pvVar7 + uVar8 * 8) = uVar6;
      iVar2 = (int)local_a0;
      if (iVar1 == iVar2) {
        if (iVar2 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          *(void **)(__ptr_00 + 2) = pvVar7;
          *__ptr_00 = 0x10;
          local_a0 = 0x10;
        }
        else {
          local_a0 = (ulong)(uint)(iVar2 * 2);
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(local_a0 * 8);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),local_a0 * 8);
          }
          *(void **)(__ptr_00 + 2) = pvVar7;
          *__ptr_00 = iVar2 * 2;
        }
      }
      else {
        pvVar7 = *(void **)(__ptr_00 + 2);
      }
      uVar6 = uVar8 + 1;
      __ptr_00[1] = (uint)uVar6;
      *(void **)((long)pvVar7 + uVar8 * 8) = pvVar3;
      uVar8 = uVar6;
    } while ((int)(iStart + (uint)uVar6) < (int)uVar10);
    uVar8 = uVar6 & 0xffffffff;
LAB_008ef562:
    uVar11 = (uint)uVar8;
    uVar10 = (uint)uVar6;
    iStart = uVar12;
  }
  if (pNew->vObjs->nSize - pNew->nDeleted < nVarsMin) {
    lVar13 = 0;
    do {
      iVar1 = (int)lVar13;
      if (pFrame->nObjs[3] <= iStart + iVar1) break;
      if ((iStart < 0) || (pFrame->vCos->nSize <= iStart + iVar1)) goto LAB_008ef89e;
      pvVar3 = pFrame->vCos->pArray[(ulong)(uint)iStart + lVar13];
      Cgt_ManDupPartition_rec
                (pNew,pFrame,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe),
                 vLeaves);
      if (((ulong)pvVar3 & 1) != 0) {
LAB_008ef8bd:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar8 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28);
      }
      iVar2 = (int)local_a8;
      if (uVar11 + iVar1 == iVar2) {
        if (iVar2 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = 0x10;
          local_a8 = 0x10;
        }
        else {
          local_a8 = (ulong)(uint)(iVar2 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar7 = malloc(local_a8 * 8);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr + 2),local_a8 * 8);
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = iVar2 * 2;
        }
      }
      else {
        pvVar7 = *(void **)(__ptr + 2);
      }
      __ptr[1] = uVar11 + 1 + iVar1;
      *(ulong *)((long)pvVar7 + lVar13 * 8 + (long)(int)uVar11 * 8) = uVar8;
      iVar2 = (int)local_a0;
      if (uVar10 + iVar1 == iVar2) {
        if (iVar2 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          *(void **)(__ptr_00 + 2) = pvVar7;
          *__ptr_00 = 0x10;
          local_a0 = 0x10;
        }
        else {
          local_a0 = (ulong)(uint)(iVar2 * 2);
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(local_a0 * 8);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),local_a0 * 8);
          }
          *(void **)(__ptr_00 + 2) = pvVar7;
          *__ptr_00 = iVar2 * 2;
        }
      }
      else {
        pvVar7 = *(void **)(__ptr_00 + 2);
      }
      __ptr_00[1] = uVar10 + iVar1 + 1;
      *(void **)((long)pvVar7 + lVar13 * 8 + (long)(int)uVar10 * 8) = pvVar3;
      lVar13 = lVar13 + 1;
    } while (pNew->vObjs->nSize - pNew->nDeleted < nVarsMin);
    uVar10 = uVar10 + (int)lVar13;
    uVar11 = uVar11 + (int)lVar13;
  }
  if (pCare != (Aig_Man_t *)0x0) {
    Cgt_ManConstructCare(pNew,pCare,vSuppsInv,vLeaves);
  }
  if (0 < (int)uVar10) {
    uVar6 = 0;
    uVar8 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar8 = uVar6;
    }
    do {
      if (uVar8 == uVar6) {
LAB_008ef89e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar13 = *(long *)(*(long *)(__ptr_00 + 2) + uVar6 * 8);
      pAVar9 = Aig_ObjCreateCo(pNew,*(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar6 * 8));
      *(Aig_Obj_t **)(lVar13 + 0x28) = pAVar9;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  if (pnOutputs != (int *)0x0) {
    *pnOutputs = uVar10;
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  return pNew;
}

Assistant:

Aig_Man_t * Cgt_ManDupPartition( Aig_Man_t * pFrame, int nVarsMin, int nFlopsMin, int iStart, Aig_Man_t * pCare, Vec_Vec_t * vSuppsInv, int * pnOutputs )
{
    Vec_Ptr_t * vRoots, * vLeaves, * vPos;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(pFrame) == 0 );
    vRoots = Vec_PtrAlloc( 100 );
    vLeaves = Vec_PtrAlloc( 100 ); 
    vPos = Vec_PtrAlloc( 100 );
    pNew = Aig_ManStart( nVarsMin );
    pNew->pName = Abc_UtilStrsav( "partition" );
    Aig_ManIncrementTravId( pFrame );
    Aig_ManConst1(pFrame)->pData = Aig_ManConst1(pNew);
    Aig_ObjSetTravIdCurrent( pFrame, Aig_ManConst1(pFrame) );
    for ( i = iStart; i < iStart + nFlopsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    for ( ; Aig_ManObjNum(pNew) < nVarsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    assert( nFlopsMin >= Vec_PtrSize(vRoots) || Vec_PtrSize(vRoots) >= nFlopsMin );
    // create constaints
    if ( pCare )
        Cgt_ManConstructCare( pNew, pCare, vSuppsInv, vLeaves );
    // create POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPos, pObj, i )
        pObj->pData = (Aig_Obj_t *)Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vRoots, i) );
    if ( pnOutputs != NULL )
        *pnOutputs = Vec_PtrSize( vPos );
    Vec_PtrFree( vRoots );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vPos );
    return pNew;
}